

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.cpp
# Opt level: O2

void __thiscall
Js::ConstructorCache::ConstructorCache(ConstructorCache *this,ConstructorCache *other)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  
  PropertyGuard::PropertyGuard(&this->super_PropertyGuard,(other->super_PropertyGuard).value);
  (this->content).scriptContext.ptr = (ScriptContext *)0x0;
  (this->content).pendingType.ptr = (DynamicType *)0x0;
  Memory::WriteBarrierPtr<Js::ScriptContext>::operator=
            (&(this->content).scriptContext,&(other->content).scriptContext);
  (this->content).slotCount = (other->content).slotCount;
  (this->content).inlineSlotCount = (other->content).inlineSlotCount;
  (this->content).updateAfterCtor = (other->content).updateAfterCtor;
  bVar5 = (other->content).field_0x14 & 8;
  bVar1 = (this->content).field_0x14;
  (this->content).field_0x14 = bVar1 & 0xf7 | bVar5;
  bVar6 = (other->content).field_0x14 & 0x10;
  (this->content).field_0x14 = bVar1 & 0xe7 | bVar5 | bVar6;
  bVar7 = (other->content).field_0x14 & 1;
  (this->content).field_0x14 = bVar1 & 0xe6 | bVar5 | bVar6 | bVar7;
  bVar8 = (other->content).field_0x14 & 2;
  (this->content).field_0x14 = bVar1 & 0xe4 | bVar5 | bVar6 | bVar7 | bVar8;
  bVar9 = (other->content).field_0x14 & 4;
  (this->content).field_0x14 = bVar1 & 0xe0 | bVar5 | bVar6 | bVar7 | bVar8 | bVar9;
  bVar10 = (other->content).field_0x14 & 0x20;
  (this->content).field_0x14 = bVar1 & 0xc0 | bVar5 | bVar6 | bVar7 | bVar8 | bVar9 | bVar10;
  (this->content).field_0x14 =
       bVar1 & 0x80 | bVar5 | bVar6 | bVar7 | bVar8 | bVar9 | bVar10 |
       (other->content).field_0x14 & 0x40;
  (this->content).callCount = (other->content).callCount;
  bVar3 = IsConsistent(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ConstructorCache.cpp"
                                ,0x2e,"(IsConsistent())","IsConsistent()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

ConstructorCache::ConstructorCache(ConstructorCache const * other) : PropertyGuard(other->GetValue())
    {
        Assert(other != nullptr);
        this->content.scriptContext = other->content.scriptContext;
        this->content.slotCount = other->content.slotCount;
        this->content.inlineSlotCount = other->content.inlineSlotCount;
        this->content.updateAfterCtor = other->content.updateAfterCtor;
        this->content.ctorHasNoExplicitReturnValue = other->content.ctorHasNoExplicitReturnValue;
        this->content.skipDefaultNewObject = other->content.skipDefaultNewObject;
        this->content.isPopulated = other->content.isPopulated;
        this->content.isPolymorphic = other->content.isPolymorphic;
        this->content.typeUpdatePending = other->content.typeUpdatePending;
        this->content.typeIsFinal = other->content.typeIsFinal;
        this->content.hasPrototypeChanged = other->content.hasPrototypeChanged;
        this->content.callCount = other->content.callCount;
        Assert(IsConsistent());
    }